

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixDynSize.cpp
# Opt level: O2

MatrixDynSize * __thiscall
iDynTree::MatrixDynSize::operator=(MatrixDynSize *this,MatrixView<const_double> *other)

{
  size_t sVar1;
  double *pdVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  
  sVar9 = other->m_rows;
  this->m_rows = sVar9;
  sVar7 = other->m_cols;
  this->m_cols = sVar7;
  uVar8 = sVar7 * sVar9;
  if (uVar8 != 0) {
    if (this->m_capacity < uVar8) {
      if ((this->m_capacity != 0) && (this->m_data != (double *)0x0)) {
        operator_delete__(this->m_data);
        sVar9 = this->m_rows;
        sVar7 = this->m_cols;
      }
      pdVar2 = (double *)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
      this->m_data = pdVar2;
      this->m_capacity = uVar8;
    }
    lVar3 = 0;
    for (sVar4 = 0; sVar4 != sVar9; sVar4 = sVar4 + 1) {
      pdVar2 = this->m_data;
      for (sVar5 = 0; sVar7 != sVar5; sVar5 = sVar5 + 1) {
        sVar6 = sVar4;
        sVar1 = sVar5;
        if (other->m_storageOrder == RowMajor) {
          sVar6 = sVar5;
          sVar1 = sVar4;
        }
        *(element_type *)((long)pdVar2 + sVar5 * 8 + lVar3) =
             other->m_storage[sVar1 * other->m_outerStride + sVar6];
      }
      lVar3 = lVar3 + sVar7 * 8;
    }
  }
  return this;
}

Assistant:

MatrixDynSize& MatrixDynSize::operator=(MatrixView<const double> other)
{
    m_rows = other.rows();
    m_cols = other.cols();

    const std::size_t requiredCapacity = m_rows * m_cols;

    // if other is empty, return
    if (requiredCapacity == 0) return  *this;

    // If the copied data fits in the currently allocated buffer,
    // use that one (if the user want to free the memory can use
    // the shrink_to_fit method).
    // Otherwise, allocate a new buffer after deleting the old one)
    if (m_capacity < requiredCapacity) {
        // need to allocate new buffer
        // if old buffer exists, delete it
        if (m_capacity > 0) {
            delete [] m_data;
        }
        m_data = new double[requiredCapacity];
        m_capacity = requiredCapacity;
    }

    for(std::size_t i = 0; i < m_rows; i++)
    {
        for(std::size_t j = 0; j < m_cols; j++)
        {
            this->m_data[this->rawIndexRowMajor(i,j)] = other(i, j);
        }
    }

    return *this;
}